

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O0

void __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::classifyVertex(SimpleToMonotone *this,int i)

{
  Edge *pEVar1;
  Edge *pEVar2;
  qint64 qVar3;
  byte bVar4;
  VertexType VVar5;
  int in_ESI;
  QPodPoint *in_RDI;
  qint64 d;
  QPodPoint *p3;
  QPodPoint *p2;
  QPodPoint *p1;
  bool endOrMerge;
  bool startOrSplit;
  Edge *e1;
  Edge *e2;
  QPodPoint *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar6;
  byte local_49;
  
  pEVar1 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                     ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                      (in_RDI + 3),(long)in_ESI);
  pEVar2 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                     ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                      (in_RDI + 3),(long)pEVar1->previous);
  local_49 = 0;
  if ((pEVar2->pointingUp & 1U) != 0) {
    local_49 = pEVar1->pointingUp ^ 0xff;
  }
  bVar6 = 0;
  if ((pEVar2->pointingUp & 1U) == 0) {
    bVar6 = pEVar1->pointingUp;
  }
  bVar4 = bVar6 & 1;
  QDataBuffer<QPodPoint>::at((QDataBuffer<QPodPoint> *)*in_RDI,(ulong)pEVar2->from);
  QDataBuffer<QPodPoint>::at((QDataBuffer<QPodPoint> *)*in_RDI,(ulong)pEVar1->from);
  QDataBuffer<QPodPoint>::at((QDataBuffer<QPodPoint> *)*in_RDI,(ulong)pEVar1->to);
  qVar3 = qPointDistanceFromLine
                    (in_RDI,(QPodPoint *)CONCAT17(bVar6,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  pEVar1->type = RegularVertex;
  if ((in_RDI[9].x & 1) == 0) {
    if ((local_49 & 1) == 0) {
      if (bVar4 != 0) {
        pEVar1->type = (uint)(qVar3 < 1);
      }
    }
    else {
      VVar5 = StartVertex;
      if (0 < qVar3) {
        VVar5 = SplitVertex;
      }
      pEVar1->type = VVar5;
    }
  }
  else if ((local_49 & 1) == 0) {
    if (bVar4 != 0) {
      pEVar1->type = (uint)(-1 < qVar3);
    }
  }
  else {
    VVar5 = StartVertex;
    if (qVar3 < 0) {
      VVar5 = SplitVertex;
    }
    pEVar1->type = VVar5;
  }
  return;
}

Assistant:

void QTriangulator<T>::SimpleToMonotone::classifyVertex(int i)
{
    Edge &e2 = m_edges.at(i);
    const Edge &e1 = m_edges.at(e2.previous);

    bool startOrSplit = (e1.pointingUp && !e2.pointingUp);
    bool endOrMerge = (!e1.pointingUp && e2.pointingUp);

    const QPodPoint &p1 = m_parent->m_vertices.at(e1.from);
    const QPodPoint &p2 = m_parent->m_vertices.at(e2.from);
    const QPodPoint &p3 = m_parent->m_vertices.at(e2.to);
    qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(p1, p2, p3);
    Q_ASSERT(d != 0 || (!startOrSplit && !endOrMerge));

    e2.type = RegularVertex;

    if (m_clockwiseOrder) {
        if (startOrSplit)
            e2.type = (d < 0 ? SplitVertex : StartVertex);
        else if (endOrMerge)
            e2.type = (d < 0 ? MergeVertex : EndVertex);
    } else {
        if (startOrSplit)
            e2.type = (d > 0 ? SplitVertex : StartVertex);
        else if (endOrMerge)
            e2.type = (d > 0 ? MergeVertex : EndVertex);
    }
}